

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_35::InMemoryFile::MmapDisposer::disposeImpl
          (MmapDisposer *this,void *firstElement,size_t elementSize,size_t elementCount,
          size_t capacity,_func_void_void_ptr *destroyElement)

{
  uint *puVar1;
  InMemoryFile *pIVar2;
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> local_30;
  
  pIVar2 = (this->ref).ptr;
  kj::_::Mutex::lock(&(pIVar2->impl).mutex,EXCLUSIVE);
  local_30.ptr = &(pIVar2->impl).value;
  puVar1 = &(pIVar2->impl).value.mmapCount;
  *puVar1 = *puVar1 - 1;
  local_30.mutex = &(pIVar2->impl).mutex;
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked(&local_30);
  Own<const_kj::(anonymous_namespace)::InMemoryFile>::~Own(&this->ref);
  operator_delete(this,0x18);
  return;
}

Assistant:

void disposeImpl(void* firstElement, size_t elementSize, size_t elementCount,
                     size_t capacity, void (*destroyElement)(void*)) const override {
      delete this;
    }